

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::bytes_source,std::allocator<char>>::
basic_bson_parser<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
          (basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source,bson_decode_options *options
          ,allocator<char> *temp_alloc)

{
  allocator *in_RCX;
  ser_context *in_RDI;
  allocator_type *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  type_conflict tVar1;
  allocator<unsigned_char> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff88;
  ser_context *__args_2;
  bytes_source *in_stack_ffffffffffffff90;
  int *__args_1;
  string *this_01;
  string *this_02;
  int local_2d [3];
  allocator *local_20;
  
  tVar1 = (type_conflict)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  local_20 = in_RCX;
  ser_context::ser_context(in_RDI);
  in_RDI->_vptr_ser_context = (_func_int **)&PTR__basic_bson_parser_01333fb8;
  *(undefined1 *)&in_RDI[1]._vptr_ser_context = 1;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ser_context + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ser_context + 2) = 0;
  *(undefined4 *)((long)&in_RDI[1]._vptr_ser_context + 4) = 0;
  bytes_source::bytes_source<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,tVar1);
  this_00 = (allocator<unsigned_char> *)(in_RDI + 5);
  bson_decode_options::bson_decode_options
            ((bson_decode_options *)this_00,(bson_decode_options *)in_stack_ffffffffffffff78);
  __args_2 = in_RDI + 8;
  __args_1 = local_2d;
  std::allocator<unsigned_char>::allocator<char>
            (this_00,(allocator<char> *)in_stack_ffffffffffffff78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
             (allocator_type *)in_stack_ffffffffffffff78);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1e8fb7);
  this_01 = (string *)(in_RDI + 0xb);
  std::__cxx11::string::string(this_01,local_20);
  this_02 = (string *)(in_RDI + 0xf);
  std::__cxx11::string::string(this_02,local_20);
  std::allocator<jsoncons::bson::parse_state>::allocator<char>
            ((allocator<jsoncons::bson::parse_state> *)this_00,
             (allocator<char> *)in_stack_ffffffffffffff78);
  std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::vector
            ((vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *)
             this_00,in_stack_ffffffffffffff78);
  std::allocator<jsoncons::bson::parse_state>::~allocator
            ((allocator<jsoncons::bson::parse_state> *)0x1e9024);
  std::vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>::
  emplace_back<jsoncons::bson::parse_mode,int,int>
            ((vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *)
             this_02,(parse_mode *)this_01,__args_1,(int *)__args_2);
  return;
}

Assistant:

basic_bson_parser(Sourceable&& source,
                      const bson_decode_options& options = bson_decode_options(),
                      const TempAllocator& temp_alloc = TempAllocator())
       : source_(std::forward<Sourceable>(source)), 
         options_(options),
         bytes_buffer_(temp_alloc),
         name_buffer_(temp_alloc),
         text_buffer_(temp_alloc),
         state_stack_(temp_alloc)
    {
        state_stack_.emplace_back(parse_mode::root,0,0);
    }